

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimetypeparser.cpp
# Opt level: O3

void __thiscall
CreateMagicMatchRuleResult::CreateMagicMatchRuleResult
          (CreateMagicMatchRuleResult *this,QStringView type,QStringView value,QStringView offsets,
          QStringView mask)

{
  storage_type_conflict *psVar1;
  long in_FS_OFFSET;
  QStringView string;
  QStringView string_00;
  QByteArray local_80;
  QString local_68;
  QByteArray local_50;
  QString local_38;
  storage_type_conflict *local_20;
  
  psVar1 = *(storage_type_conflict **)(in_FS_OFFSET + 0x28);
  (this->errorMessage).d.d = (Data *)0x0;
  (this->errorMessage).d.ptr = (char16_t *)0x0;
  (this->errorMessage).d.size = 0;
  local_20 = psVar1;
  QString::QString(&local_38,(QChar *)type.m_data,type.m_size);
  string.m_data = psVar1;
  string.m_size = (qsizetype)value.m_data;
  QtPrivate::convertToUtf8(&local_50,(QtPrivate *)value.m_size,string);
  QString::QString(&local_68,(QChar *)offsets.m_data,offsets.m_size);
  string_00.m_data = psVar1;
  string_00.m_size = (qsizetype)mask.m_data;
  QtPrivate::convertToLatin1(&local_80,(QtPrivate *)mask.m_size,string_00);
  QMimeMagicRule::QMimeMagicRule
            (&this->rule,&local_38,&local_50,&local_68,&local_80,&this->errorMessage);
  if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(storage_type_conflict **)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CreateMagicMatchRuleResult(QStringView type, QStringView value, QStringView offsets, QStringView mask)
        : errorMessage(), rule(type.toString(), value.toUtf8(), offsets.toString(), mask.toLatin1(), &errorMessage)
    {

    }